

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GenerateHeaderSetVerificationFile
          (string *__return_storage_ptr__,cmGeneratorTarget *this,cmSourceFile *source,string *dir,
          optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *languages)

{
  _Base_ptr p_Var1;
  pointer pcVar2;
  pointer pAVar3;
  pointer pAVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int iVar6;
  int iVar7;
  string *psVar8;
  const_iterator cVar9;
  cmSourceFileLocation *pcVar10;
  cmSourceFile *this_00;
  ostream *poVar11;
  undefined1 __v [8];
  char *pcVar12;
  pointer pAVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string *filename;
  string headerFilename;
  string language;
  string extension;
  cmGeneratedFileStream fout;
  _Alloc_node __an;
  long *local_340;
  long local_338;
  long local_330 [2];
  long *local_320;
  char *local_318;
  long local_310 [2];
  undefined1 *local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  const_iterator local_2e0;
  cmSourceFile *local_2d8;
  string *local_2d0;
  undefined1 local_2c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  size_type local_2a8;
  pointer local_2a0;
  undefined8 local_298;
  char *local_290;
  long local_288;
  long *local_280;
  char *local_278;
  undefined1 *local_270;
  _Alloc_node local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  local_300 = &local_2f0;
  local_2f8 = (char *)0x0;
  local_2f0 = 0;
  local_2d8 = source;
  local_2d0 = dir;
  psVar8 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  local_320 = local_310;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar2,pcVar2 + psVar8->_M_string_length);
  if (local_318 == (char *)0x0) {
    if ((languages->
        super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_engaged == false) {
      local_2e0._M_node =
           (_Base_ptr)
           ((long)&(languages->
                   super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_payload + 8);
      *(undefined8 *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x10) = 0;
      *(undefined8 *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x18) = 0;
      *(undefined8 *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x20) = 0;
      *(undefined8 *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x28) = 0;
      *(undefined8 *)
       &(languages->
        super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_payload = 0;
      *(undefined8 *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 8) = 0;
      *(_Base_ptr *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x18) = local_2e0._M_node;
      *(_Base_ptr *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x20) = local_2e0._M_node;
      *(undefined8 *)
       ((long)&(languages->
               super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_payload + 0x28) = 0;
      (languages->
      super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged = true;
      if ((this->AllConfigSources).
          super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->AllConfigSources).
          super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ComputeAllConfigSources(this);
      }
      pAVar3 = (this->AllConfigSources).
               super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar4 = (this->AllConfigSources).
               super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pAVar3 != pAVar4) {
        do {
          pAVar13 = pAVar3 + 1;
          psVar8 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(pAVar3->Source);
          iVar6 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar6 == 0) {
            local_2c8 = (undefined1  [8])&local_2b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CXX","");
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)languages,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8);
LAB_004c7d86:
            if (local_2c8 != (undefined1  [8])&local_2b8) {
              operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)psVar8);
            if (iVar7 == 0) {
              local_2c8 = (undefined1  [8])&local_2b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"C","");
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)languages,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8);
              goto LAB_004c7d86;
            }
          }
        } while ((iVar6 != 0) && (pAVar3 = pAVar13, pAVar13 != pAVar4));
      }
      if (*(long *)((long)&(languages->
                           super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_payload + 0x28) == 0) {
        local_2c8 = (undefined1  [8])0x0;
        pbStack_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_2b8._M_allocated_capacity = 0;
        cmGlobalGenerator::GetEnabledLanguages
                  (this->GlobalGenerator,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c8);
        pbVar5 = pbStack_2c0;
        cVar9._M_node = local_2e0._M_node;
        local_60._M_t =
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)languages;
        if (local_2c8 != (undefined1  [8])pbStack_2c0) {
          __v = local_2c8;
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)languages,cVar9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                       &local_60);
            __v = (undefined1  [8])((long)__v + 0x20);
          } while (__v != (undefined1  [8])pbVar5);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c8);
      }
    }
    pcVar12 = "CXX";
    local_2c8 = (undefined1  [8])&local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CXX","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)languages,(key_type *)local_2c8);
    p_Var1 = (_Base_ptr)
             ((long)&(languages->
                     super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_payload + 8);
    if (local_2c8 != (undefined1  [8])&local_2b8) {
      operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
    }
    if (cVar9._M_node == p_Var1) {
      pcVar12 = "C";
      local_2c8 = (undefined1  [8])&local_2b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"C","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)languages,(key_type *)local_2c8);
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
      }
      if (cVar9._M_node == p_Var1) goto LAB_004c7f1b;
    }
    std::__cxx11::string::_M_replace((ulong)&local_320,0,local_318,(ulong)pcVar12);
  }
LAB_004c7f1b:
  iVar6 = std::__cxx11::string::compare((char *)&local_320);
  if (iVar6 == 0) {
    pcVar12 = ".c";
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&local_320);
    if (iVar6 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_004c81de;
    }
    pcVar12 = ".cxx";
  }
  std::__cxx11::string::_M_replace((ulong)&local_300,0,local_2f8,(ulong)pcVar12);
  pcVar2 = (local_2d0->_M_dataplus)._M_p;
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,pcVar2,pcVar2 + local_2d0->_M_string_length);
  if (local_338 != 0) {
    std::__cxx11::string::push_back((char)&local_340);
  }
  pcVar10 = cmSourceFile::GetLocation(local_2d8);
  std::__cxx11::string::_M_append((char *)&local_340,(ulong)(pcVar10->Name)._M_dataplus._M_p);
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (psVar8->_M_dataplus)._M_p;
  pcVar2 = (pointer)psVar8->_M_string_length;
  puStack_58 = local_50;
  local_60._M_t =
       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&DAT_00000001;
  local_50[0] = 0x2f;
  psVar8 = cmTarget::GetName_abi_cxx11_(this->Target);
  local_2b8._M_allocated_capacity = (size_type)local_60._M_t;
  local_2b8._8_8_ = puStack_58;
  local_2a0 = (psVar8->_M_dataplus)._M_p;
  local_2a8 = psVar8->_M_string_length;
  local_298 = 0x1e;
  local_290 = "_verify_interface_header_sets/";
  local_288 = local_338;
  local_280 = local_340;
  local_278 = local_2f8;
  local_270 = local_300;
  views._M_len = 6;
  views._M_array = (iterator)local_2c8;
  local_2c8 = (undefined1  [8])pcVar2;
  pbStack_2c0 = pbVar5;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  this_00 = cmMakefile::GetOrCreateSource(this->Makefile,__return_storage_ptr__,false,Ambiguous);
  local_2c8 = (undefined1  [8])&local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"LANGUAGE","");
  cmSourceFile::SetProperty(this_00,(string *)local_2c8,(string *)&local_320);
  if (local_2c8 != (undefined1  [8])&local_2b8) {
    operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
  }
  cmsys::SystemTools::GetFilenamePath((string *)local_2c8,__return_storage_ptr__);
  cmsys::SystemTools::MakeDirectory((string *)local_2c8,(mode_t *)0x0);
  if (local_2c8 != (undefined1  [8])&local_2b8) {
    operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2c8,__return_storage_ptr__,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2c8,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"#include <",10);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2c8,(char *)local_340,local_338);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"> // IWYU pragma: associated\n",0x1d);
  std::ofstream::close();
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c8);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
LAB_004c81de:
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GenerateHeaderSetVerificationFile(
  cmSourceFile& source, const std::string& dir,
  cm::optional<std::set<std::string>>& languages) const
{
  std::string extension;
  std::string language = source.GetOrDetermineLanguage();

  if (language.empty()) {
    if (!languages) {
      languages.emplace();
      for (auto const& tgtSource : this->GetAllConfigSources()) {
        auto const& tgtSourceLanguage =
          tgtSource.Source->GetOrDetermineLanguage();
        if (tgtSourceLanguage == "CXX") {
          languages->insert("CXX");
          break; // C++ overrides everything else, so we don't need to keep
                 // checking.
        }
        if (tgtSourceLanguage == "C") {
          languages->insert("C");
        }
      }

      if (languages->empty()) {
        std::vector<std::string> languagesVector;
        this->GlobalGenerator->GetEnabledLanguages(languagesVector);
        languages->insert(languagesVector.begin(), languagesVector.end());
      }
    }

    if (languages->count("CXX")) {
      language = "CXX";
    } else if (languages->count("C")) {
      language = "C";
    }
  }

  if (language == "C") {
    extension = ".c";
  } else if (language == "CXX") {
    extension = ".cxx";
  } else {
    return "";
  }

  std::string headerFilename = dir;
  if (!headerFilename.empty()) {
    headerFilename += '/';
  }
  headerFilename += source.GetLocation().GetName();

  auto filename = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), '/', this->GetName(),
    "_verify_interface_header_sets/", headerFilename, extension);
  auto* verificationSource = this->Makefile->GetOrCreateSource(filename);
  verificationSource->SetProperty("LANGUAGE", language);

  cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(filename));

  cmGeneratedFileStream fout(filename);
  fout.SetCopyIfDifferent(true);
  // IWYU pragma: associated allows include what you use to
  // consider the headerFile as part of the entire language
  // unit within include-what-you-use and as a result allows
  // one to get IWYU advice for headers :)
  fout << "#include <" << headerFilename << "> // IWYU pragma: associated\n";
  fout.close();

  return filename;
}